

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

void __thiscall PSound::WriteValue(PSound *this,FSerializer *ar,char *key,void *addr)

{
  char *cptr;
  char *local_8;
  
  if ((long)*addr == 0) {
    local_8 = (char *)0x0;
  }
  else {
    local_8 = S_sfx.Array[*addr].name.Chars;
  }
  FSerializer::StringPtr(ar,key,&local_8);
  return;
}

Assistant:

void PSound::WriteValue(FSerializer &ar, const char *key,const void *addr) const
{
	const char *cptr = *(const FSoundID *)addr;
	ar.StringPtr(key, cptr);
}